

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaInfo.hpp
# Opt level: O0

SchemaInfo * __thiscall xercesc_4_0::SchemaInfo::getImportInfo(SchemaInfo *this,uint namespaceURI)

{
  uint uVar1;
  SchemaInfo *this_00;
  ulong local_48;
  XMLSize_t local_38;
  XMLSize_t i;
  SchemaInfo *currInfo;
  XMLSize_t importSize;
  uint namespaceURI_local;
  SchemaInfo *this_local;
  
  if (this->fImportedInfoList == (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
    local_48 = 0;
  }
  else {
    local_48 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::size
                         (&this->fImportedInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>);
  }
  local_38 = 0;
  while( true ) {
    if (local_48 <= local_38) {
      return (SchemaInfo *)0x0;
    }
    this_00 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                        (&this->fImportedInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,
                         local_38);
    uVar1 = getTargetNSURI(this_00);
    if (uVar1 == namespaceURI) break;
    local_38 = local_38 + 1;
  }
  return this_00;
}

Assistant:

inline SchemaInfo* SchemaInfo::getImportInfo(const unsigned int namespaceURI) const {

    XMLSize_t importSize = (fImportedInfoList) ? fImportedInfoList->size() : 0;
    SchemaInfo* currInfo = 0;

    for (XMLSize_t i=0; i < importSize; i++) {

        currInfo = fImportedInfoList->elementAt(i);

        if (currInfo->getTargetNSURI() == (int) namespaceURI)
            return currInfo;
    }

    return 0;
}